

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O0

void * sznet::detail::startThread(void *obj)

{
  ThreadData *data;
  void *obj_local;
  
  ThreadData::runInThread((ThreadData *)obj);
  if (obj != (void *)0x0) {
    ThreadData::~ThreadData((ThreadData *)obj);
    operator_delete(obj);
  }
  return (void *)0x0;
}

Assistant:

sz_thread_func_return startThread(void* obj)
{
	ThreadData* data = static_cast<ThreadData*>(obj);
	data->runInThread();
	delete data;
	data = nullptr;

	return 0;
}